

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,mz_uint32 ext_attributes)

{
  char cVar1;
  bool bVar2;
  undefined4 uVar3;
  mz_uint16 method;
  mz_uint16 mVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  mz_bool mVar8;
  tdefl_status tVar9;
  char *pcVar10;
  FILE *__stream;
  void *pvVar11;
  size_t sVar12;
  mz_uint8 *ptr;
  ulong uVar13;
  void *pvVar14;
  uint uVar15;
  long lVar16;
  void *pvVar17;
  ushort uVar18;
  mz_uint16 dos_date_00;
  mz_uint64 cur_file_ofs;
  mz_ulong uncomp_size;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  ulong local_120;
  void *local_118;
  size_t local_110;
  int local_104;
  tdefl_compressor *local_100;
  ulong local_f8;
  ulong local_f0;
  void *local_e8;
  mz_zip_writer_add_state state;
  mz_uint8 local_dir_header [30];
  time_t local_70;
  
  dos_time = 0;
  dos_date = 0;
  uVar6 = 6;
  if (-1 < (int)level_and_flags) {
    uVar6 = level_and_flags;
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if (pZip->m_pState == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if (10 < (uVar6 & 0xf) || pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if ((uVar6 >> 10 & 1) != 0) {
    return 0;
  }
  if (*pArchive_name == '/') {
    return 0;
  }
  cur_file_ofs = pZip->m_archive_size;
  for (pcVar10 = pArchive_name; cVar1 = *pcVar10, cVar1 != '\0'; pcVar10 = pcVar10 + 1) {
    if (cVar1 == ':') {
      return 0;
    }
    if (cVar1 == '\\') {
      return 0;
    }
  }
  local_e8 = pComment;
  local_110 = strlen(pArchive_name);
  if (0xffff < local_110) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  iVar7 = (int)pZip->m_file_offset_alignment;
  uVar15 = iVar7 - 1;
  local_120 = 0;
  if (pZip->m_file_offset_alignment != 0) {
    local_120 = (ulong)(iVar7 - (uVar15 & (uint)cur_file_ofs) & uVar15);
  }
  local_f8 = local_120 + cur_file_ofs;
  local_f0 = (ulong)comment_size;
  if (local_110 + local_f0 + local_f8 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  iVar7 = stat(pSrc_filename,(stat *)local_dir_header);
  if (iVar7 != 0) {
    return 0;
  }
  mz_zip_time_t_to_dos_time(local_70,&dos_time,&dos_date);
  __stream = fopen(pSrc_filename,"rb");
  if (__stream == (FILE *)0x0) {
    return 0;
  }
  fseeko(__stream,0,2);
  pvVar11 = (void *)ftello(__stream);
  fseeko(__stream,0,0);
  if ((ulong)pvVar11 >> 0x20 != 0) {
    fclose(__stream);
    return 0;
  }
  uVar6 = uVar6 & 0xf;
  if (pvVar11 < (void *)0x4) {
    uVar6 = 0;
  }
  lVar16 = local_120 + 0x1e;
  local_118 = pvVar11;
  mVar8 = mz_zip_writer_write_zeros(pZip,cur_file_ofs,(mz_uint32)lVar16);
  sVar5 = local_110;
  if (mVar8 != 0) {
    if ((pZip->m_file_offset_alignment != 0) &&
       ((local_f8 & pZip->m_file_offset_alignment - 1) != 0)) {
      __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                    ,0x18d6,
                    "mz_bool mz_zip_writer_add_file(mz_zip_archive *, const char *, const char *, const void *, mz_uint16, mz_uint, mz_uint32)"
                   );
    }
    local_120 = lVar16 + cur_file_ofs;
    local_dir_header[0x10] = '\0';
    local_dir_header[0x11] = '\0';
    local_dir_header[0x12] = '\0';
    local_dir_header[0x13] = '\0';
    local_dir_header[0x14] = '\0';
    local_dir_header[0x15] = '\0';
    local_dir_header[0x16] = '\0';
    local_dir_header[0x17] = '\0';
    local_dir_header[0x18] = '\0';
    local_dir_header[0x19] = '\0';
    local_dir_header[0x1a] = '\0';
    local_dir_header[0x1b] = '\0';
    local_dir_header[0x1c] = '\0';
    local_dir_header[0x1d] = '\0';
    local_dir_header[0] = '\0';
    local_dir_header[1] = '\0';
    local_dir_header[2] = '\0';
    local_dir_header[3] = '\0';
    local_dir_header[4] = '\0';
    local_dir_header[5] = '\0';
    local_dir_header[6] = '\0';
    local_dir_header[7] = '\0';
    local_dir_header[8] = '\0';
    local_dir_header[9] = '\0';
    local_dir_header[10] = '\0';
    local_dir_header[0xb] = '\0';
    local_dir_header[0xc] = '\0';
    local_dir_header[0xd] = '\0';
    local_dir_header[0xe] = '\0';
    local_dir_header[0xf] = '\0';
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_120,pArchive_name,local_110);
    if (sVar12 == sVar5) {
      local_120 = local_120 + local_110;
      pvVar11 = (void *)0x0;
      if (local_118 == (void *)0x0) {
        uVar18 = 0;
        uncomp_size = 0;
      }
      else {
        ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
        if (ptr == (mz_uint8 *)0x0) {
          fclose(__stream);
          pvVar11 = (void *)0x0;
          bVar2 = false;
          uVar18 = 0;
          uncomp_size = 0;
        }
        else if (uVar6 == 0) {
          uncomp_size = 0;
          pvVar11 = local_118;
          do {
            if (pvVar11 == (void *)0x0) {
              uVar18 = 0;
              pvVar11 = local_118;
              goto LAB_003c2845;
            }
            pvVar17 = (void *)0x10000;
            if (pvVar11 < (void *)0x10000) {
              pvVar17 = pvVar11;
            }
            pvVar14 = (void *)fread(ptr,1,(size_t)pvVar17,__stream);
            if ((pvVar14 == pvVar17) &&
               (pvVar14 = (void *)(*pZip->m_pWrite)(pZip->m_pIO_opaque,local_120,ptr,(size_t)pvVar17
                                                   ), pvVar14 == pvVar17)) {
              uncomp_size = mz_crc32(uncomp_size & 0xffffffff,ptr,(size_t)pvVar17);
              pvVar11 = (void *)((long)pvVar11 - (long)pvVar17);
              local_120 = local_120 + (long)pvVar17;
              bVar2 = true;
            }
            else {
              (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
              fclose(__stream);
              bVar2 = false;
            }
          } while (bVar2);
          pvVar11 = (void *)0x0;
          bVar2 = false;
          uVar18 = 0;
        }
        else {
          local_100 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
          if (local_100 == (tdefl_compressor *)0x0) {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
            fclose(__stream);
            pvVar11 = (void *)0x0;
            bVar2 = false;
            uVar18 = 0;
            uncomp_size = 0;
          }
          else {
            state.m_cur_archive_file_ofs = local_120;
            uVar13 = 10;
            if (uVar6 < 10) {
              uVar13 = (ulong)uVar6;
            }
            state.m_comp_size = 0;
            state.m_pZip = pZip;
            tdefl_init(local_100,mz_zip_writer_add_put_buf_callback,&state,
                       (uint)(uVar6 < 4) << 0xe |
                       tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar13]);
            local_104 = 0;
            uncomp_size = 0;
            pvVar11 = local_118;
            do {
              pvVar17 = (void *)0x10000;
              if (pvVar11 < (void *)0x10000) {
                pvVar17 = pvVar11;
              }
              pvVar14 = (void *)fread(ptr,1,(size_t)pvVar17,__stream);
              if (pvVar14 == pvVar17) {
                uncomp_size = mz_crc32(uncomp_size & 0xffffffff,ptr,(size_t)pvVar17);
                pvVar11 = (void *)((long)pvVar11 - (long)pvVar17);
                tVar9 = tdefl_compress_buffer
                                  (local_100,ptr,(size_t)pvVar17,(uint)(pvVar11 == (void *)0x0) << 2
                                  );
                if (tVar9 == TDEFL_STATUS_OKAY) {
                  bVar2 = true;
                }
                else {
                  if (tVar9 != TDEFL_STATUS_DONE) goto LAB_003c26d6;
                  bVar2 = false;
                  local_104 = 1;
                }
              }
              else {
LAB_003c26d6:
                bVar2 = false;
              }
            } while (bVar2);
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_100);
            if (local_104 == 0) {
              (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
              fclose(__stream);
              pvVar11 = (void *)0x0;
              bVar2 = false;
              uVar18 = 0;
            }
            else {
              local_120 = state.m_cur_archive_file_ofs;
              uVar18 = 8;
              bVar2 = true;
              pvVar11 = (void *)state.m_comp_size;
            }
          }
          if (bVar2) {
LAB_003c2845:
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
        }
        if (!bVar2) {
          return 0;
        }
      }
      fclose(__stream);
      mVar4 = dos_time;
      method = dos_date;
      if ((ulong)pvVar11 >> 0x20 != 0) {
        return 0;
      }
      if (local_120 >> 0x20 == 0) {
        local_dir_header[4] = '\x14';
        if (uVar18 == 0) {
          local_dir_header[4] = '\0';
        }
        builtin_memcpy(local_dir_header,"PK\x03\x04",4);
        local_dir_header[5] = '\0';
        local_dir_header[6] = '\0';
        local_dir_header[7] = '\0';
        local_dir_header[8] = (mz_uint8)uVar18;
        local_dir_header[9] = '\0';
        local_dir_header[10] = (mz_uint8)dos_time;
        local_dir_header[0xb] = (mz_uint8)(dos_time >> 8);
        local_dir_header[0xc] = (mz_uint8)dos_date;
        local_dir_header[0xd] = (mz_uint8)(dos_date >> 8);
        local_dir_header[0xe] = (mz_uint8)uncomp_size;
        local_dir_header[0xf] = (mz_uint8)(uncomp_size >> 8);
        local_dir_header[0x10] = (mz_uint8)(uncomp_size >> 0x10);
        local_dir_header[0x11] = (mz_uint8)(uncomp_size >> 0x18);
        local_dir_header[0x12] = (mz_uint8)pvVar11;
        local_dir_header[0x13] = (mz_uint8)((ulong)pvVar11 >> 8);
        local_dir_header[0x14] = (mz_uint8)((ulong)pvVar11 >> 0x10);
        local_dir_header[0x15] = (mz_uint8)((ulong)pvVar11 >> 0x18);
        uVar3 = SUB84(local_118,0);
        local_dir_header[0x1a] = (char)local_110;
        local_dir_header[0x16] = (char)uVar3;
        local_dir_header[0x17] = (char)((uint)uVar3 >> 8);
        local_dir_header[0x18] = (char)((uint)uVar3 >> 0x10);
        local_dir_header[0x19] = (char)((uint)uVar3 >> 0x18);
        local_dir_header[0x1b] = (char)(local_110 >> 8);
        local_dir_header[0x1c] = '\0';
        local_dir_header[0x1d] = '\0';
        dos_date_00 = 0x2962;
        sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_f8,local_dir_header,0x1e);
        if (sVar12 == 0x1e) {
          mVar8 = mz_zip_writer_add_to_central_dir
                            (pZip,pArchive_name,(mz_uint16)local_110,local_e8,(mz_uint16)local_f0,
                             local_118,(mz_uint16)pvVar11,uncomp_size,(ulong)uVar18,(uint)mVar4,
                             method,(mz_uint16)local_f8,(mz_uint16)ext_attributes,dos_date_00,
                             uncomp_size,(uint)mVar4);
          if (mVar8 != 0) {
            pZip->m_total_files = pZip->m_total_files + 1;
            pZip->m_archive_size = local_120;
            return 1;
          }
          return 0;
        }
        return 0;
      }
      return 0;
    }
  }
  fclose(__stream);
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive *pZip, const char *pArchive_name,
                               const char *pSrc_filename, const void *pComment,
                               mz_uint16 comment_size, mz_uint level_and_flags,
                               mz_uint32 ext_attributes) {
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  time_t file_modified_time;
  mz_uint64 local_dir_header_ofs, cur_archive_file_ofs, uncomp_size = 0,
                                                        comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  MZ_FILE *pSrc_file = NULL;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;

  local_dir_header_ofs = cur_archive_file_ofs = pZip->m_archive_size;

  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  memset(&file_modified_time, 0, sizeof(file_modified_time));
  if (!mz_zip_get_file_modified_time(pSrc_filename, &file_modified_time))
    return MZ_FALSE;
  mz_zip_time_t_to_dos_time(file_modified_time, &dos_time, &dos_date);

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return MZ_FALSE;
  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  if (uncomp_size > 0xFFFFFFFF) {
    // No zip64 support yet
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  if (uncomp_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (uncomp_size) {
    mz_uint64 uncomp_remaining = uncomp_size;
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      MZ_FCLOSE(pSrc_file);
      return MZ_FALSE;
    }

    if (!level) {
      while (uncomp_remaining) {
        mz_uint n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
        if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) ||
            (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                            n) != n)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          MZ_FCLOSE(pSrc_file);
          return MZ_FALSE;
        }
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        uncomp_remaining -= n;
        cur_archive_file_ofs += n;
      }
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      for (;;) {
        size_t in_buf_size =
            (mz_uint32)MZ_MIN(uncomp_remaining, MZ_ZIP_MAX_IO_BUF_SIZE);
        tdefl_status status;

        if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
          break;

        uncomp_crc32 = (mz_uint32)mz_crc32(
            uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
        uncomp_remaining -= in_buf_size;

        status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size,
                                       uncomp_remaining ? TDEFL_NO_FLUSH
                                                        : TDEFL_FINISH);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY)
          break;
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;

      method = MZ_DEFLATED;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  MZ_FCLOSE(pSrc_file);
  pSrc_file = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}